

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_identifier(version_parser *this,string *out)

{
  pointer ptVar1;
  token_type tVar2;
  token_stream *ptVar3;
  variant_alternative_t<1UL,_variant<monostate,_unsigned_char,_char,_range_operator>_> *pvVar4;
  size_t sVar5;
  int iVar6;
  pointer ptVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char **ppcVar12;
  char *pcVar13;
  from_chars_result fVar14;
  token token;
  string result;
  undefined8 local_68;
  char *pcStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  local_38 = out;
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  ptVar3 = this->stream;
  ptVar1 = (ptVar3->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start + ptVar3->current;
  local_68._0_1_ = ptVar1->type;
  local_68._1_2_ = ptVar1->value;
  local_68._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
  pcStack_60 = ptVar1->lexeme;
  ptVar3->current = ptVar3->current + 1;
  ppcVar12 = &pcStack_60;
  do {
    if ((char)local_68 == '\x06') {
      pvVar4 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_68 + 1));
      uVar9 = 0;
      if (*pvVar4 == '\0') {
        iVar6 = 0;
        iVar10 = 0;
        while (tVar2 = (this->stream->tokens).
                       super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [this->stream->current + (long)(int)uVar9].type, (byte)(tVar2 - hyphen) < 3)
        {
          iVar6 = iVar6 + 1;
          iVar10 = iVar10 + (uint)(tVar2 == digit);
          uVar9 = uVar9 + 1;
        }
        uVar9 = (uint)(iVar10 == iVar6 && 0 < iVar10);
      }
      if ((char)uVar9 != '\0') {
        uVar8 = 0x16;
        pcVar13 = pcStack_60;
        goto LAB_0015ee03;
      }
      std::__cxx11::string::push_back((char)&local_58);
    }
    else {
      if ((char)local_68 == '\x05') {
        std::get<2UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                  ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                   ((long)&local_68 + 1));
      }
      else if ((char)local_68 != '\x04') {
        uVar8 = 0x16;
        goto LAB_0015ee00;
      }
      std::__cxx11::string::push_back((char)&local_58);
    }
    ptVar3 = this->stream;
    sVar5 = ptVar3->current;
    ptVar7 = (ptVar3->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = sVar5 * 0x10;
    ptVar1 = ptVar7 + sVar5;
    uVar8._0_1_ = ptVar1->type;
    uVar8._1_2_ = ptVar1->value;
    uVar8._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
    if ((undefined1)uVar8 != '\x04') {
      sVar5 = ptVar3->current;
      ptVar7 = (ptVar3->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar11 = sVar5 * 0x10;
      ptVar1 = ptVar7 + sVar5;
      uVar8._0_1_ = ptVar1->type;
      uVar8._1_2_ = ptVar1->value;
      uVar8._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
      if ((undefined1)uVar8 != '\x05') {
        sVar5 = ptVar3->current;
        ptVar7 = (ptVar3->tokens).
                 super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = sVar5 * 0x10;
        ptVar1 = ptVar7 + sVar5;
        uVar8._0_1_ = ptVar1->type;
        uVar8._1_2_ = ptVar1->value;
        uVar8._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
        if ((undefined1)uVar8 != '\x06') {
          std::__cxx11::string::_M_assign((string *)local_38);
          ppcVar12 = &(this->stream->tokens).
                      super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                      ._M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
          uVar8 = 0;
LAB_0015ee00:
          pcVar13 = *ppcVar12;
LAB_0015ee03:
          if (local_58 != &local_48) {
            operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
          }
          fVar14.super_from_chars_result._8_8_ = uVar8;
          fVar14.super_from_chars_result.ptr = pcVar13;
          return (from_chars_result)fVar14.super_from_chars_result;
        }
      }
    }
    pcStack_60 = *(char **)((long)&ptVar7->lexeme + lVar11);
    ptVar3->current = sVar5 + 1;
    local_68 = uVar8;
  } while( true );
}

Assistant:

parse_prerelease_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);

        // numerical prerelease identifier doesn't allow leading zero 
        // 1.2.3-1.alpha is valid,
        // 1.2.3-01b is valid as well, but
        // 1.2.3-01.alpha is not valid

        if (is_leading_zero(digit)) {
          return failure(token.lexeme);
        }

        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }